

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManResetRefs(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    if (pvVar2 != (void *)0x0) {
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f;
    }
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if (pAVar3 != (Aig_Obj_t *)0x0) {
      pAVar4 = Aig_ObjFanin0(pAVar3);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        pAVar4 = Aig_ObjFanin0(pAVar3);
        *(ulong *)&pAVar4->field_0x18 =
             *(ulong *)&pAVar4->field_0x18 & 0xffffffff0000003f |
             ((ulong)(((uint)(*(ulong *)&pAVar4->field_0x18 >> 6) & 0x3ffffff) + 1) & 0x3ffffff) <<
             6;
      }
      pAVar4 = Aig_ObjFanin1(pAVar3);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        pAVar3 = Aig_ObjFanin1(pAVar3);
        *(ulong *)&pAVar3->field_0x18 =
             *(ulong *)&pAVar3->field_0x18 & 0xffffffff0000003f |
             ((ulong)(((uint)(*(ulong *)&pAVar3->field_0x18 >> 6) & 0x3ffffff) + 1) & 0x3ffffff) <<
             6;
      }
    }
  }
  return;
}

Assistant:

void Aig_ManResetRefs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) )
            Aig_ObjFanin0(pObj)->nRefs++;
        if ( Aig_ObjFanin1(pObj) )
            Aig_ObjFanin1(pObj)->nRefs++;
    }
}